

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O3

void template_load(void)

{
  Fl_Browser *this;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  dirent **files;
  char path [1024];
  char filename [1024];
  char name [1024];
  dirent **local_c48;
  uint local_c3c;
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  Fl_Preferences::getUserdataPath(&fluid_prefs,local_c38,0x400);
  fl_strlcat(local_c38,"templates",0x400);
  local_c3c = fl_filename_list(local_c38,&local_c48,fl_numericsort);
  if ((int)local_c3c < 1) {
    return;
  }
  uVar4 = (ulong)local_c3c;
  uVar3 = 0;
LAB_001a01d6:
  iVar1 = fl_filename_match(local_c48[uVar3]->d_name,"*.fl");
  if (iVar1 != 0) {
    fl_strlcpy(local_438,local_c48[uVar3]->d_name,0x400);
    pcVar2 = strstr(local_438,".fl");
    *pcVar2 = '\0';
    pcVar2 = local_438;
    do {
      if (*pcVar2 == '_') {
        *pcVar2 = ' ';
      }
      else if (*pcVar2 == '\0') goto LAB_001a0236;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  goto LAB_001a027a;
LAB_001a0236:
  snprintf(local_838,0x400,"%s/%s",local_c38,local_c48[uVar3]->d_name);
  this = template_browser;
  pcVar2 = strdup(local_838);
  Fl_Browser::add(this,local_438,pcVar2);
LAB_001a027a:
  free(local_c48[uVar3]);
  uVar3 = uVar3 + 1;
  if (uVar3 == uVar4) {
    if ((int)local_c3c < 1) {
      return;
    }
    free(local_c48);
    return;
  }
  goto LAB_001a01d6;
}

Assistant:

void template_load() {
  int i;
  char name[1024], filename[1024], path[1024], *ptr;
  struct dirent **files;
  int num_files;
  
  fluid_prefs.getUserdataPath(path, sizeof(path));
  strlcat(path, "templates", sizeof(path));
  
  num_files = fl_filename_list(path, &files);
  
  for (i = 0; i < num_files; i ++) {
    if (fl_filename_match(files[i]->d_name, "*.fl")) {
      // Format the name as the filename with "_" replaced with " "
      // and without the trailing ".fl"...
      strlcpy(name, files[i]->d_name, sizeof(name));
      *strstr(name, ".fl") = '\0';
  
      for (ptr = name; *ptr; ptr ++) {
        if (*ptr == '_') *ptr = ' ';
      }
  
      // Add the template to the browser...
      snprintf(filename, sizeof(filename), "%s/%s", path, files[i]->d_name);
      template_browser->add(name, strdup(filename));
    }
  
    free(files[i]);
  }
  
  if (num_files > 0) free(files);
}